

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O3

int tcu::measurePixelDiffAccuracy
              (TestLog *log,char *imageSetName,char *imageSetDesc,Surface *reference,Surface *result
              ,int bestScoreDiff,int worstScoreDiff,CompareLogMode logMode)

{
  int iVar1;
  void *pvVar2;
  TextureFormat local_88;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  local_80.m_format.order = RGBA;
  local_80.m_format.type = UNORM_INT8;
  pvVar2 = (void *)(reference->m_pixels).m_cap;
  if (pvVar2 != (void *)0x0) {
    pvVar2 = (reference->m_pixels).m_ptr;
  }
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_58,&local_80.m_format,reference->m_width,reference->m_height,1,pvVar2);
  local_88.order = RGBA;
  local_88.type = UNORM_INT8;
  pvVar2 = (void *)(result->m_pixels).m_cap;
  if (pvVar2 != (void *)0x0) {
    pvVar2 = (result->m_pixels).m_ptr;
  }
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_80,&local_88,result->m_width,result->m_height,1,pvVar2);
  iVar1 = measurePixelDiffAccuracy
                    (log,imageSetName,imageSetDesc,&local_58,&local_80,bestScoreDiff,worstScoreDiff,
                     logMode);
  return iVar1;
}

Assistant:

int measurePixelDiffAccuracy (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Surface& reference, const Surface& result, int bestScoreDiff, int worstScoreDiff, CompareLogMode logMode)
{
	return measurePixelDiffAccuracy(log, imageSetName, imageSetDesc, reference.getAccess(), result.getAccess(), bestScoreDiff, worstScoreDiff, logMode);
}